

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

AsmJsVarType Js::AsmJsVarType::FromCheckedType(AsmJsType type)

{
  code *pcVar1;
  bool bVar2;
  Which WVar3;
  undefined4 *puVar4;
  AsmJsType local_10;
  AsmJsVarType local_9;
  AsmJsType type_local;
  
  local_10.which_ = type.which_;
  bVar2 = AsmJsType::isInt(&local_10);
  if (!bVar2) {
    bVar2 = AsmJsType::isMaybeDouble(&local_10);
    if (!bVar2) {
      bVar2 = AsmJsType::isFloatish(&local_10);
      if (!bVar2) {
        bVar2 = AsmJsType::isSIMDType(&local_10);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                      ,0x159,
                                      "(type.isInt() || type.isMaybeDouble() || type.isFloatish() || type.isSIMDType())"
                                      ,
                                      "type.isInt() || type.isMaybeDouble() || type.isFloatish() || type.isSIMDType()"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
  }
  bVar2 = AsmJsType::isMaybeDouble(&local_10);
  if (bVar2) {
    AsmJsVarType(&local_9,Double);
  }
  else {
    bVar2 = AsmJsType::isFloatish(&local_10);
    if (bVar2) {
      AsmJsVarType(&local_9,Float);
    }
    else {
      bVar2 = AsmJsType::isInt(&local_10);
      if (bVar2) {
        AsmJsVarType(&local_9,Int);
      }
      else {
        WVar3 = AsmJsType::GetWhich(&local_10);
        AsmJsVarType(&local_9,(Which)WVar3);
      }
    }
  }
  return (AsmJsVarType)local_9.which_;
}

Assistant:

Js::AsmJsVarType AsmJsVarType::FromCheckedType(AsmJsType type)
    {
        Assert( type.isInt() || type.isMaybeDouble() || type.isFloatish() || type.isSIMDType());

        if (type.isMaybeDouble())
            return Double;
        else if (type.isFloatish())
            return Float;
        else if (type.isInt())
            return Int;
        else
        {
            // SIMD type
            return AsmJsVarType::Which(type.GetWhich());
        }

    }